

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::resize
          (QList<QStyleOptionViewItem::ViewItemPosition> *this,qsizetype size)

{
  ViewItemPosition VVar1;
  Data *pDVar2;
  long lVar3;
  ViewItemPosition *pVVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) <
      size)) {
    QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(ViewItemPosition **)0x0,
               (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    pVVar4 = (this->d).ptr;
    pVVar4[lVar3] = Invalid;
    auVar7 = _DAT_0066f670;
    auVar6 = _DAT_0066f660;
    auVar5 = _DAT_0066f650;
    if (pVVar4 + lVar3 + 1 != pVVar4 + size) {
      pVVar4 = pVVar4 + lVar3;
      uVar8 = (size * 4 + lVar3 * -4) - 8;
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar10._0_8_ = uVar8 >> 2;
      auVar10._8_8_ = auVar13._8_8_ >> 2;
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_0066f670;
      do {
        auVar12._8_4_ = (int)uVar9;
        auVar12._0_8_ = uVar9;
        auVar12._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar12 | auVar6) ^ auVar7;
        iVar11 = auVar10._4_4_;
        VVar1 = *pVVar4;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          pVVar4[uVar9 + 1] = VVar1;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          pVVar4[uVar9 + 2] = VVar1;
        }
        auVar13 = (auVar12 | auVar5) ^ auVar7;
        iVar14 = auVar13._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar13._0_4_ <= auVar10._0_4_)) {
          pVVar4[uVar9 + 3] = VVar1;
          pVVar4[uVar9 + 4] = VVar1;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }